

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

AndConstraint * __thiscall icu_63::OrConstraint::add(OrConstraint *this,UErrorCode *status)

{
  UBool UVar1;
  AndConstraint *this_00;
  UErrorCode *size;
  AndConstraint *local_48;
  OrConstraint *local_28;
  OrConstraint *curOrConstraint;
  UErrorCode *status_local;
  OrConstraint *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(this->fInternalStatus);
  local_28 = this;
  if (UVar1 == '\0') {
    for (; local_28->next != (OrConstraint *)0x0; local_28 = local_28->next) {
    }
    this_00 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
    local_48 = (AndConstraint *)0x0;
    if (this_00 != (AndConstraint *)0x0) {
      memset(this_00,0,0x38);
      AndConstraint::AndConstraint(this_00);
      local_48 = this_00;
    }
    local_28->childNode = local_48;
    if (local_28->childNode == (AndConstraint *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    this_local = (OrConstraint *)local_28->childNode;
  }
  else {
    *status = this->fInternalStatus;
    this_local = (OrConstraint *)0x0;
  }
  return (AndConstraint *)this_local;
}

Assistant:

AndConstraint*
OrConstraint::add(UErrorCode& status) {
    if (U_FAILURE(fInternalStatus)) {
        status = fInternalStatus;
        return nullptr;
    }
    OrConstraint *curOrConstraint=this;
    {
        while (curOrConstraint->next!=nullptr) {
            curOrConstraint = curOrConstraint->next;
        }
        U_ASSERT(curOrConstraint->childNode == nullptr);
        curOrConstraint->childNode = new AndConstraint();
        if (curOrConstraint->childNode == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
    }
    return curOrConstraint->childNode;
}